

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

PyObject * pybind11::cpp_function::dispatcher(PyObject *self,PyObject *args_in,PyObject *kwargs_in)

{
  uint __val;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  handle hVar4;
  _Bit_pointer puVar5;
  PyTypeObject **ppPVar6;
  bool bVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  type_info *find_type;
  long lVar11;
  handle hVar12;
  undefined8 *puVar13;
  long *plVar14;
  function_record *pfVar15;
  object *poVar16;
  error_already_set *this;
  instance *piVar17;
  ulong uVar18;
  byte bVar19;
  pointer paVar20;
  pointer paVar21;
  PyTypeObject *pPVar22;
  PyObject *tmp;
  pointer paVar23;
  size_type __new_size;
  uint __len;
  function_record *pfVar24;
  uint __uval;
  uint uVar25;
  function_record *pfVar26;
  bool bVar27;
  handle arg;
  tuple extra_args;
  dict kwargs_1;
  vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
  second_pass;
  loader_life_support guard_1;
  dict kwargs;
  value_and_holder self_value_and_holder;
  instance *pi;
  undefined1 local_1c8 [24];
  object oStack_1b0;
  _Bit_pointer local_1a8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  _Bit_pointer local_178;
  PyTypeObject *local_170;
  handle local_168;
  pointer local_160;
  undefined1 local_158 [32];
  undefined1 local_138 [8];
  undefined1 auStack_130 [12];
  undefined4 uStack_124;
  handle hStack_120;
  anon_union_24_2_63b86169_for_instance_1 local_118;
  handle hStack_100;
  _Bit_pointer local_f8;
  handle hStack_f0;
  handle local_e8;
  handle local_e0;
  handle local_d8;
  pointer local_d0;
  function_record *local_c8;
  function_record *local_c0;
  handle local_b8;
  long local_b0;
  PyObject local_a8;
  instance *local_98;
  return_value_policy rStack_90;
  undefined1 uStack_8f;
  uint16_t uStack_8e;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  PyObject *local_70;
  PyTypeObject *local_68;
  hashfunc local_58;
  pointer local_50;
  PyTypeObject **local_48;
  handle local_40;
  object local_38;
  
  local_170 = (PyTypeObject *)PyCapsule_GetPointer(self,0);
  if ((args_in->ob_type->tp_flags & 0x4000000) == 0) {
    __assert_fail("PyTuple_Check(args_in)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/daniellasry[P]CPPTest/pybind11/include/pybind11/pybind11.h"
                  ,0x1ac,
                  "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                 );
  }
  paVar23 = (pointer)args_in[1].ob_refcnt;
  if (paVar23 == (pointer)0x0) {
    local_68 = (PyTypeObject *)0x0;
  }
  else {
    local_68 = args_in[1].ob_type;
  }
  local_98 = (instance *)0x0;
  if (((ulong)local_170->tp_repr & 0x100) != 0) {
    find_type = detail::get_type_info((PyTypeObject *)local_170->tp_as_sequence);
    detail::instance::get_value_and_holder
              ((value_and_holder *)local_138,(instance *)local_68,find_type,false);
    uVar1 = auStack_130._0_8_;
    local_88 = auStack_130._8_4_;
    uStack_84 = uStack_124;
    uStack_80 = hStack_120.m_ptr._0_4_;
    uStack_7c = hStack_120.m_ptr._4_4_;
    local_98 = (instance *)local_138;
    rStack_90 = auStack_130[0];
    uStack_8f = auStack_130[1];
    uStack_8e = auStack_130._2_2_;
    uStack_8c = auStack_130._4_4_;
    if ((type_info *)stack0xfffffffffffffed8 == (type_info *)0x0 ||
        local_138 == (undefined1  [8])0x0) {
      PyErr_SetString(_PyExc_TypeError,"__init__(self, ...) called with invalid `self` argument");
      return (PyObject *)0x0;
    }
    bVar8 = (byte)((PyObject *)((long)local_138 + 0x30))->ob_refcnt;
    if ((bVar8 & 2) == 0) {
      bVar8 = *(byte *)((long)(PyObject **)uVar1 +
                       (long)&((PyObject *)((long)local_138 + 0x10))->ob_type->ob_base) & 2;
    }
    else {
      bVar8 = bVar8 >> 3 & 1;
    }
    auStack_130._0_8_ = uVar1;
    if (bVar8 != 0) {
      __Py_NoneStruct = __Py_NoneStruct + 1;
      local_138 = (undefined1  [8])0x0;
      object::~object((object *)local_138);
      return (PyObject *)&_Py_NoneStruct;
    }
  }
  local_158._0_8_ = (PyObject *)0x0;
  local_158._8_8_ = (function_record *)0x0;
  local_158._16_8_ = (pointer)0x0;
  local_58 = local_170->tp_hash;
  local_48 = &args_in[1].ob_type;
  local_70 = (PyObject *)0x1;
  hVar12.m_ptr = (PyObject *)local_170;
  local_160 = paVar23;
  local_c8 = (function_record *)args_in;
  local_c0 = (function_record *)kwargs_in;
  do {
    bVar8 = *(byte *)((long)&hVar12.m_ptr[5].ob_type + 1);
    bVar19 = (bVar8 & 0x10) >> 4;
    paVar21 = (pointer)((long)((char)(bVar8 << 2) >> 7) +
                       ((ulong)*(ushort *)((long)&hVar12.m_ptr[5].ob_type + 2) - (ulong)bVar19));
    if (((bVar19 != 0) || (paVar23 <= paVar21)) &&
       ((paVar21 <= paVar23 ||
        (paVar21 <= (pointer)(hVar12.m_ptr[2].ob_refcnt - (long)hVar12.m_ptr[1].ob_type >> 5))))) {
      local_118.simple_value_holder[2] = (function_record *)0x0;
      hStack_100.m_ptr = hStack_100.m_ptr & 0xffffffff00000000;
      local_118.simple_value_holder[1] =
           (void *)((ulong)local_118.simple_value_holder[1] & 0xffffffff00000000);
      hStack_120.m_ptr = (PyObject *)0x0;
      local_118.simple_value_holder[0] = (function_record *)0x0;
      auStack_130._0_8_ = (pointer)0x0;
      stack0xfffffffffffffed8 = (handle *)0x0;
      local_e8.m_ptr = (PyObject *)0x0;
      local_f8 = (_Bit_pointer)0x0;
      hStack_f0.m_ptr = (PyObject *)0x0;
      local_e0.m_ptr = (PyObject *)local_68;
      local_d8.m_ptr = (PyObject *)0x0;
      local_138 = (undefined1  [8])hVar12.m_ptr;
      std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::reserve
                ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_130,
                 (ulong)*(ushort *)((long)&hVar12.m_ptr[5].ob_type + 2));
      std::vector<bool,_std::allocator<bool>_>::reserve
                ((vector<bool,_std::allocator<bool>_> *)&local_118.nonsimple,
                 (ulong)*(ushort *)((long)&hVar12.m_ptr[5].ob_type + 2));
      local_d0 = paVar21;
      if (paVar23 < paVar21) {
        local_d0 = paVar23;
      }
      local_50 = paVar21;
      if (((ulong)hVar12.m_ptr[5].ob_type & 0x200) == 0) {
        paVar21 = (pointer)0x0;
      }
      else {
        if (*(long *)CONCAT44(uStack_7c,uStack_80) != 0) {
          (**(code **)(CONCAT44(uStack_84,local_88) + 0x38))((function_record *)&local_98);
        }
        if ((((PyTypeObject *)
             (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&local_c8->doc)->
             super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>)._M_impl.
             super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
          __assert_fail("PyTuple_Check(args_in)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/daniellasry[P]CPPTest/pybind11/include/pybind11/pybind11.h"
                        ,0x1f8,
                        "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                       );
        }
        local_d8.m_ptr =
             *(PyObject **)
              &(local_c8->args).
               super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
               ._M_impl.super__Vector_impl_data;
        local_1c8._0_8_ = (function_record *)&local_98;
        if ((PyObject *)stack0xfffffffffffffed8 == hStack_120.m_ptr) {
          std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::
          _M_realloc_insert<pybind11::handle>
                    ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)auStack_130,
                     stack0xfffffffffffffed8,(handle *)local_1c8);
        }
        else {
          stack0xfffffffffffffed8->m_ptr = (PyObject *)&local_98;
          unique0x00006b80 = stack0xfffffffffffffed8 + 1;
        }
        paVar21 = (pointer)0x1;
        std::vector<bool,_std::allocator<bool>_>::push_back
                  ((vector<bool,_std::allocator<bool>_> *)&local_118.nonsimple,false);
      }
      paVar20 = paVar21;
      if (paVar21 < local_d0) {
        uVar18 = (ulong)(uint)((int)paVar21 << 5);
        do {
          pPVar22 = hVar12.m_ptr[1].ob_type;
          if (paVar21 < (pointer)(hVar12.m_ptr[2].ob_refcnt - (long)pPVar22 >> 5)) {
            plVar14 = (long *)((long)&(pPVar22->ob_base).ob_base.ob_refcnt + uVar18);
            bVar27 = pPVar22 != (PyTypeObject *)0x0;
            if ((((local_c0 != (function_record *)0x0) && (pPVar22 != (PyTypeObject *)0x0)) &&
                (bVar27 = true, *plVar14 != 0)) &&
               (lVar11 = PyDict_GetItemString(local_c0), lVar11 != 0)) {
LAB_0010d780:
              bVar27 = false;
              paVar23 = local_160;
              goto LAB_0010dae3;
            }
            if ((((PyTypeObject *)
                 (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&local_c8->doc)->
                 super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>)._M_impl.
                 super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) goto LAB_0010e614;
            local_1c8._0_8_ = local_c8->data[(long)(paVar21 + -4)];
            if (bVar27) {
              bVar27 = true;
              if (((*(byte *)((long)&pPVar22->tp_name + uVar18) & 2) == 0) &&
                 ((function_record *)local_1c8._0_8_ == (function_record *)&_Py_NoneStruct))
              goto LAB_0010d780;
            }
            else {
              bVar27 = false;
            }
          }
          else {
            if ((((PyTypeObject *)
                 (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&local_c8->doc)->
                 super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>)._M_impl.
                 super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
LAB_0010e614:
              __assert_fail("PyTuple_Check(args_in)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/daniellasry[P]CPPTest/pybind11/include/pybind11/pybind11.h"
                            ,0x207,
                            "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                           );
            }
            local_1c8._0_8_ = local_c8->data[(long)(paVar21 + -4)];
            bVar27 = false;
            plVar14 = (long *)0x0;
          }
          if ((PyObject *)stack0xfffffffffffffed8 == hStack_120.m_ptr) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<pybind11::handle_const&>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_130,
                       stack0xfffffffffffffed8,(handle *)local_1c8);
          }
          else {
            stack0xfffffffffffffed8->m_ptr = (PyObject *)local_1c8._0_8_;
            unique0x00006b80 = stack0xfffffffffffffed8 + 1;
          }
          bVar8 = 1;
          if (bVar27) {
            bVar8 = *(byte *)(plVar14 + 3);
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_118.nonsimple,(bool)(bVar8 & 1));
          paVar21 = paVar21 + 1;
          uVar18 = uVar18 + 0x20;
          paVar20 = local_d0;
          paVar23 = local_160;
        } while (local_d0 != paVar21);
      }
      local_b8.m_ptr = (PyObject *)local_c0;
      if (local_c0 != (function_record *)0x0) {
        local_c0->name = (char *)((long)&((function_record *)local_c0->name)->name + 1);
      }
      if (paVar20 < local_50) {
        lVar11 = (long)paVar20 << 5;
        bVar27 = false;
        do {
          pPVar22 = hVar12.m_ptr[1].ob_type;
          local_1c8._0_8_ = (function_record *)0x0;
          if (((local_c0 == (function_record *)0x0) ||
              (*(long *)((long)&(pPVar22->ob_base).ob_base.ob_refcnt + lVar11) == 0)) ||
             (local_1c8._0_8_ = PyDict_GetItemString(local_b8.m_ptr),
             (function_record *)local_1c8._0_8_ == (function_record *)0x0)) {
            pfVar15 = *(function_record **)((long)&(pPVar22->ob_base).ob_size + lVar11);
            pfVar24 = (function_record *)local_1c8._0_8_;
            paVar23 = local_160;
          }
          else {
            if (!bVar27) {
              local_198._0_8_ = PyDict_Copy(local_b8.m_ptr);
              object::operator=((object *)&local_b8,(object *)local_198);
              object::~object((object *)local_198);
            }
            PyDict_DelItemString
                      (local_b8.m_ptr,
                       *(undefined8 *)((long)&(pPVar22->ob_base).ob_base.ob_refcnt + lVar11));
            bVar27 = true;
            pfVar15 = (function_record *)local_1c8._0_8_;
            pfVar24 = (function_record *)local_1c8._0_8_;
            paVar23 = local_160;
          }
          local_1c8._0_8_ = pfVar15;
          local_160 = paVar23;
          if ((function_record *)local_1c8._0_8_ == (function_record *)0x0) {
            bVar27 = false;
            local_1c8._0_8_ = pfVar24;
            goto LAB_0010dad6;
          }
          if ((PyObject *)unique0x100022a3 == hStack_120.m_ptr) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<pybind11::handle_const&>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_130,
                       unique0x100022a3,(handle *)local_1c8);
          }
          else {
            unique0x100022a3->m_ptr = (PyObject *)local_1c8._0_8_;
            unique0x00006b80 = unique0x100022a3 + 1;
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_118.nonsimple,
                     (bool)(*(byte *)((long)&pPVar22->tp_name + lVar11) & 1));
          paVar20 = paVar20 + 1;
          lVar11 = lVar11 + 0x20;
          paVar23 = local_160;
        } while (paVar20 < local_50);
      }
      if ((function_record *)local_b8.m_ptr == (function_record *)0x0) {
        bVar8 = *(byte *)((long)&hVar12.m_ptr[5].ob_type + 1);
LAB_0010d6bc:
        if ((bVar8 & 0x10) != 0) {
          tuple::tuple((tuple *)local_198,0);
          if (local_d0 == (pointer)0x0) {
            local_1c8._0_8_ = local_c8;
            local_c8->name = (char *)((long)&((function_record *)local_c8->name)->name + 1);
LAB_0010d7b2:
            object::operator=((object *)local_198,(object *)local_1c8);
            object::~object((object *)local_1c8);
          }
          else {
            pfVar24 = (function_record *)(paVar23 + -(long)paVar20);
            if (paVar23 < paVar20 || pfVar24 == (function_record *)0x0) {
              tuple::tuple((tuple *)local_1c8,0);
              goto LAB_0010d7b2;
            }
            tuple::tuple((tuple *)local_1c8,(size_t)pfVar24);
            object::operator=((object *)local_198,(object *)local_1c8);
            object::~object((object *)local_1c8);
            ppPVar6 = local_48;
            pfVar15 = (function_record *)0x0;
            do {
              if ((((PyTypeObject *)
                   (((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)&local_c8->doc)
                   ->super__Vector_base<pybind11::handle,_std::allocator<pybind11::handle>_>).
                   _M_impl.super__Vector_impl_data._M_start)->tp_flags & 0x4000000) == 0) {
                __assert_fail("PyTuple_Check(args_in)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/daniellasry[P]CPPTest/pybind11/include/pybind11/pybind11.h"
                              ,0x248,
                              "static PyObject *pybind11::cpp_function::dispatcher(PyObject *, PyObject *, PyObject *)"
                             );
              }
              local_1c8._8_8_ = local_198._0_8_;
              oStack_1b0.super_handle.m_ptr = (handle)(PyObject *)0x0;
              local_1c8._16_8_ = pfVar15;
              detail::accessor_policies::tuple_item::set
                        ((handle)local_198._0_8_,(size_t)pfVar15,
                         (PyObject *)ppPVar6[(long)((long)&pfVar15->name + (long)paVar20)]);
              object::~object((object *)(local_1c8 + 0x18));
              pfVar15 = (function_record *)((long)&pfVar15->name + 1);
            } while (pfVar24 != pfVar15);
          }
          if ((PyObject *)stack0xfffffffffffffed8 == hStack_120.m_ptr) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<pybind11::handle_const&>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_130,
                       stack0xfffffffffffffed8,(handle *)local_198);
          }
          else {
            stack0xfffffffffffffed8->m_ptr = (PyObject *)local_198._0_8_;
            unique0x00006b80 = stack0xfffffffffffffed8 + 1;
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_118.nonsimple,false);
          object::operator=((object *)&hStack_f0,(object *)local_198);
          object::~object((object *)local_198);
          bVar8 = *(byte *)((long)&hVar12.m_ptr[5].ob_type + 1);
          paVar23 = local_160;
        }
        if ((bVar8 & 0x20) != 0) {
          if ((function_record *)local_b8.m_ptr == (function_record *)0x0) {
            dict::dict((dict *)local_1c8);
            object::operator=((object *)&local_b8,(object *)local_1c8);
            object::~object((object *)local_1c8);
          }
          if ((PyObject *)stack0xfffffffffffffed8 == hStack_120.m_ptr) {
            std::vector<pybind11::handle,std::allocator<pybind11::handle>>::
            _M_realloc_insert<pybind11::handle_const&>
                      ((vector<pybind11::handle,std::allocator<pybind11::handle>> *)auStack_130,
                       stack0xfffffffffffffed8,&local_b8);
          }
          else {
            stack0xfffffffffffffed8->m_ptr = local_b8.m_ptr;
            unique0x00006b80 = stack0xfffffffffffffed8 + 1;
          }
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)&local_118.nonsimple,false);
          object::operator=((object *)&local_e8,(object *)&local_b8);
        }
        __new_size = (long)stack0xfffffffffffffed8 - auStack_130._0_8_ >> 3;
        if ((__new_size != *(ushort *)((long)&hVar12.m_ptr[5].ob_type + 2)) ||
           (((ulong)hStack_100.m_ptr & 0xffffffff) +
            ((long)local_118.simple_value_holder[2] - local_118._0_8_) * 8 != __new_size)) {
          pybind11_fail(
                       "Internal error: function call dispatcher inserted wrong number of arguments!"
                       );
        }
        local_198._0_8_ = (PyObject *)0x0;
        local_198._8_8_ = local_198._8_8_ & 0xffffffff00000000;
        local_188._0_8_ = (function_record *)0x0;
        local_188._8_8_ = local_188._8_8_ & 0xffffffff00000000;
        local_178 = (_Bit_pointer)0x0;
        if (local_58 != (hashfunc)0x0) {
          std::vector<bool,_std::allocator<bool>_>::resize
                    ((vector<bool,_std::allocator<bool>_> *)local_198,__new_size,false);
          puVar5 = local_f8;
          hVar4.m_ptr = hStack_100.m_ptr;
          uVar3 = local_118.simple_value_holder[2];
          uVar2 = local_118.simple_value_holder[1];
          uVar1 = local_118.simple_value_holder[0];
          local_1a8 = local_f8;
          local_1c8._16_8_ = local_118.simple_value_holder[2];
          oStack_1b0.super_handle.m_ptr = (handle)(handle)hStack_100.m_ptr;
          local_1c8._0_8_ = local_118.simple_value_holder[0];
          local_1c8._8_8_ = local_118.simple_value_holder[1];
          local_f8 = local_178;
          local_118.simple_value_holder[2] = (void *)local_188._0_8_;
          hStack_100.m_ptr = (PyObject *)local_188._8_8_;
          local_118.simple_value_holder[0] = (void *)local_198._0_8_;
          local_118.simple_value_holder[1] = (void *)local_198._8_8_;
          local_178 = puVar5;
          local_188._0_8_ = uVar3;
          local_188._8_8_ = hVar4.m_ptr;
          local_198._0_8_ = uVar1;
          local_198._8_8_ = uVar2;
        }
        detail::loader_life_support::loader_life_support((loader_life_support *)local_1c8);
        local_70 = (PyObject *)(*(code *)hVar12.m_ptr[3].ob_refcnt)(local_138);
        detail::loader_life_support::~loader_life_support((loader_life_support *)local_1c8);
        puVar5 = local_f8;
        hVar4.m_ptr = hStack_100.m_ptr;
        uVar3 = local_118.simple_value_holder[2];
        uVar2 = local_118.simple_value_holder[1];
        uVar1 = local_118.simple_value_holder[0];
        bVar27 = local_70 != (PyObject *)0x1;
        if (local_58 != (hashfunc)0x0 && !bVar27) {
          for (paVar21 = (pointer)(ulong)(*(byte *)((long)&hVar12.m_ptr[5].ob_type + 1) >> 6 & 1);
              paVar21 < local_50; paVar21 = paVar21 + 1) {
            paVar20 = paVar21 + 0x3f;
            if (-1 < (long)paVar21) {
              paVar20 = paVar21;
            }
            if ((*(ulong *)(local_198._0_8_ +
                           (ulong)(((ulong)paVar21 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                           ((long)paVar20 >> 6) * 8 + -8) >> ((ulong)paVar21 & 0x3f) & 1) != 0) {
              local_1a8 = local_f8;
              local_1c8._16_8_ = local_118.simple_value_holder[2];
              oStack_1b0.super_handle.m_ptr = (handle)(handle)hStack_100.m_ptr;
              local_1c8._0_8_ = local_118.simple_value_holder[0];
              local_1c8._8_8_ = local_118.simple_value_holder[1];
              local_f8 = local_178;
              local_118.simple_value_holder[2] = (void *)local_188._0_8_;
              hStack_100.m_ptr = (PyObject *)local_188._8_8_;
              local_118.simple_value_holder[0] = (void *)local_198._0_8_;
              local_118.simple_value_holder[1] = (void *)local_198._8_8_;
              local_178 = puVar5;
              local_188._0_8_ = uVar3;
              local_188._8_8_ = hVar4.m_ptr;
              local_198._0_8_ = uVar1;
              local_198._8_8_ = uVar2;
              std::
              vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
              ::emplace_back<pybind11::detail::function_call>
                        ((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                          *)local_158,(function_call *)local_138);
              break;
            }
          }
          bVar27 = false;
        }
        if ((function_record *)local_198._0_8_ != (function_record *)0x0) {
          operator_delete((void *)local_198._0_8_,(long)local_178 - local_198._0_8_);
        }
      }
      else {
        lVar11 = PyDict_Size();
        bVar8 = *(byte *)((long)&hVar12.m_ptr[5].ob_type + 1);
        if ((lVar11 == 0) || ((bVar8 & 0x20) != 0)) goto LAB_0010d6bc;
        bVar27 = false;
      }
LAB_0010dad6:
      object::~object((object *)&local_b8);
LAB_0010dae3:
      object::~object((object *)&local_e8);
      object::~object((object *)&hStack_f0);
      if ((function_record *)local_118.simple_value_holder[0] != (function_record *)0x0) {
        operator_delete(local_118.simple_value_holder[0],(long)local_f8 - local_118._0_8_);
        local_118.simple_value_holder[0] = (function_record *)0x0;
        local_118.simple_value_holder[1] =
             (void *)((ulong)local_118.simple_value_holder[1] & 0xffffffff00000000);
        local_118.simple_value_holder[2] = (function_record *)0x0;
        hStack_100.m_ptr = hStack_100.m_ptr & 0xffffffff00000000;
        local_f8 = (_Bit_pointer)0x0;
      }
      if ((pointer)auStack_130._0_8_ != (pointer)0x0) {
        operator_delete((void *)auStack_130._0_8_,(long)hStack_120.m_ptr - auStack_130._0_8_);
      }
      if (bVar27) break;
    }
    hVar12.m_ptr = (PyObject *)(((instance *)(hVar12.m_ptr + 7))->ob_base).ob_type;
  } while ((PyTypeObject *)hVar12.m_ptr != (PyTypeObject *)0x0);
  hVar12.m_ptr = local_70;
  uVar1 = local_158._8_8_;
  if ((local_58 == (hashfunc)0x0) || (local_158._0_8_ == local_158._8_8_)) {
    std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
    ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
             *)local_158);
    if (hVar12.m_ptr != (PyObject *)0x1) goto LAB_0010dc10;
  }
  else {
    if (local_70 != (PyObject *)0x1) {
LAB_0010dbf0:
      std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
      ::~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
                 *)local_158);
LAB_0010dc10:
      if (hVar12.m_ptr != (PyObject *)0x0) {
        if (((ulong)local_170->tp_repr & 0x100) == 0) {
          return hVar12.m_ptr;
        }
        if ((local_98->field_0x30 & 2) == 0) {
          bVar8 = (local_98->field_1).nonsimple.status[CONCAT44(uStack_8c,_rStack_90)];
        }
        else {
          bVar8 = (byte)local_98->field_0x30 >> 2;
        }
        if ((bVar8 & 1) == 0) {
          (**(code **)(CONCAT44(uStack_84,local_88) + 0x30))(local_68,0);
          return hVar12.m_ptr;
        }
        return hVar12.m_ptr;
      }
      local_138 = (undefined1  [8])(auStack_130 + 8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_138,
                 "Unable to convert function return value to a Python type! The signature was\n\t",
                 "");
      std::__cxx11::string::append(local_138);
      lVar11 = std::__cxx11::string::find(local_138,0x115111,0);
      if (lVar11 != -1) {
        std::__cxx11::string::append(local_138);
      }
      PyErr_SetString(_PyExc_TypeError,local_138);
      if (local_138 == (undefined1  [8])(auStack_130 + 8)) {
        return (PyObject *)0x0;
      }
      goto LAB_0010e5ed;
    }
    pfVar24 = (function_record *)local_158._0_8_;
    do {
      detail::loader_life_support::loader_life_support((loader_life_support *)local_138);
      hVar12 = (*((function_record *)pfVar24->name)->impl)((function_call *)pfVar24);
      detail::loader_life_support::~loader_life_support((loader_life_support *)local_138);
      if (hVar12.m_ptr != (PyObject *)0x1) goto LAB_0010dbf0;
      pfVar24 = (function_record *)&pfVar24->scope;
    } while (pfVar24 != (function_record *)uVar1);
    std::vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>::
    ~vector((vector<pybind11::detail::function_call,_std::allocator<pybind11::detail::function_call>_>
             *)local_158);
  }
  if (((ulong)local_170->tp_repr & 0x800) != 0) {
    __Py_NotImplementedStruct = __Py_NotImplementedStruct + 1;
    return (PyObject *)&_Py_NotImplementedStruct;
  }
  std::__cxx11::string::string
            ((string *)local_158,(char *)(local_170->ob_base).ob_base.ob_refcnt,
             (allocator *)&local_168);
  puVar13 = (undefined8 *)std::__cxx11::string::append(local_158);
  local_198._0_8_ = local_188;
  pfVar24 = (function_record *)(puVar13 + 2);
  if ((function_record *)*puVar13 == pfVar24) {
    local_188._0_8_ = pfVar24->name;
    local_188._8_8_ = puVar13[3];
  }
  else {
    local_188._0_8_ = pfVar24->name;
    local_198._0_8_ = (PyObject *)*puVar13;
  }
  local_198._8_8_ = puVar13[1];
  *puVar13 = pfVar24;
  puVar13[1] = 0;
  *(undefined1 *)(puVar13 + 2) = 0;
  bVar8 = *(byte *)((long)&local_170->tp_repr + 1);
  iVar10 = 0x114f0c;
  if ((bVar8 & 1) != 0) {
    iVar10 = 0x114f00;
  }
  local_b8.m_ptr = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,iVar10,iVar10 + (bVar8 & 1) * 3 + 8);
  pfVar24 = (function_record *)((long)(function_record **)local_198._8_8_ + local_b0);
  pfVar15 = (function_record *)0xf;
  if ((function_record *)local_198._0_8_ != (function_record *)local_188) {
    pfVar15 = (function_record *)local_188._0_8_;
  }
  if (pfVar15 < pfVar24) {
    pfVar15 = (function_record *)0xf;
    if (local_b8.m_ptr != &local_a8) {
      pfVar15 = (function_record *)local_a8.ob_refcnt;
    }
    if (pfVar15 < pfVar24) goto LAB_0010de9f;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,local_198._0_8_);
  }
  else {
LAB_0010de9f:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append(local_198,(ulong)local_b8.m_ptr);
  }
  local_1c8._0_8_ = local_1c8 + 0x10;
  pfVar24 = (function_record *)(puVar13 + 2);
  if ((function_record *)*puVar13 == pfVar24) {
    local_1c8._16_8_ = pfVar24->name;
    oStack_1b0.super_handle.m_ptr = (handle)puVar13[3];
  }
  else {
    local_1c8._16_8_ = pfVar24->name;
    local_1c8._0_8_ = (function_record *)*puVar13;
  }
  local_1c8._8_8_ = puVar13[1];
  *puVar13 = pfVar24;
  puVar13[1] = 0;
  *(undefined1 *)&pfVar24->name = 0;
  plVar14 = (long *)std::__cxx11::string::append(local_1c8);
  local_138 = (undefined1  [8])(auStack_130 + 8);
  piVar17 = (instance *)(plVar14 + 2);
  if ((instance *)*plVar14 == piVar17) {
    unique0x10001239 = (handle *)(piVar17->ob_base).ob_refcnt;
    hStack_120.m_ptr = (PyObject *)plVar14[3];
  }
  else {
    unique0x00012000 = (handle *)(piVar17->ob_base).ob_refcnt;
    local_138 = (undefined1  [8])*plVar14;
  }
  auStack_130._0_8_ = plVar14[1];
  *plVar14 = (long)piVar17;
  plVar14[1] = 0;
  *(undefined1 *)(plVar14 + 2) = 0;
  if ((function_record *)local_1c8._0_8_ != (function_record *)(local_1c8 + 0x10)) {
    operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
  }
  if (local_b8.m_ptr != &local_a8) {
    operator_delete(local_b8.m_ptr,(ulong)((long)(char **)local_a8.ob_refcnt + 1));
  }
  if ((function_record *)local_198._0_8_ != (function_record *)local_188) {
    operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
  }
  if ((function_record *)local_158._0_8_ != (function_record *)(local_158 + 0x10)) {
    operator_delete((void *)local_158._0_8_,(ulong)((long)(function_record **)local_158._16_8_ + 1))
    ;
  }
  pPVar22 = local_170;
  uVar25 = 0;
  do {
    __val = uVar25 + 1;
    __len = 1;
    if (8 < uVar25) {
      uVar18 = (ulong)__val;
      uVar25 = 4;
      do {
        __len = uVar25;
        uVar9 = (uint)uVar18;
        if (uVar9 < 100) {
          __len = __len - 2;
          goto LAB_0010e040;
        }
        if (uVar9 < 1000) {
          __len = __len - 1;
          goto LAB_0010e040;
        }
        if (uVar9 < 10000) goto LAB_0010e040;
        uVar18 = uVar18 / 10000;
        uVar25 = __len + 4;
      } while (99999 < uVar9);
      __len = __len + 1;
    }
LAB_0010e040:
    local_158._0_8_ = local_158 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_158,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_158._0_8_,__len,__val);
    puVar13 = (undefined8 *)std::__cxx11::string::replace((ulong)local_158,0,(char *)0x0,0x114f4e);
    local_198._0_8_ = local_188;
    pfVar24 = (function_record *)(puVar13 + 2);
    if ((function_record *)*puVar13 == pfVar24) {
      local_188._0_8_ = pfVar24->name;
      local_188._8_8_ = puVar13[3];
    }
    else {
      local_188._0_8_ = pfVar24->name;
      local_198._0_8_ = (PyObject *)*puVar13;
    }
    local_198._8_8_ = puVar13[1];
    *puVar13 = pfVar24;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    puVar13 = (undefined8 *)std::__cxx11::string::append(local_198);
    local_1c8._0_8_ = local_1c8 + 0x10;
    pfVar24 = (function_record *)(puVar13 + 2);
    if ((function_record *)*puVar13 == pfVar24) {
      local_1c8._16_8_ = pfVar24->name;
      oStack_1b0.super_handle.m_ptr = (handle)puVar13[3];
    }
    else {
      local_1c8._16_8_ = pfVar24->name;
      local_1c8._0_8_ = (function_record *)*puVar13;
    }
    local_1c8._8_8_ = puVar13[1];
    *puVar13 = pfVar24;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_138,local_1c8._0_8_);
    if ((function_record *)local_1c8._0_8_ != (function_record *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
    }
    if ((function_record *)local_198._0_8_ != (function_record *)local_188) {
      operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
    }
    if ((function_record *)local_158._0_8_ != (function_record *)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_,
                      (ulong)((long)(function_record **)local_158._16_8_ + 1));
    }
    if (((ulong)local_170->tp_repr & 0x100) == 0) {
LAB_0010e2b9:
      std::__cxx11::string::append((char *)local_138);
    }
    else {
      std::__cxx11::string::string
                ((string *)local_1c8,(char *)(pPVar22->ob_base).ob_size,(allocator *)local_198);
      lVar11 = std::__cxx11::string::find((char)local_1c8,0x28);
      pfVar24 = (function_record *)(lVar11 + 7);
      if ((ulong)local_1c8._8_8_ <= pfVar24) {
LAB_0010e29e:
        if ((function_record *)local_1c8._0_8_ != (function_record *)(local_1c8 + 0x10)) {
          operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
        }
        goto LAB_0010e2b9;
      }
      pfVar15 = (function_record *)std::__cxx11::string::find(local_1c8,0x114f53,0);
      local_d0 = (pointer)std::__cxx11::string::rfind(local_1c8,0x114f56,0xffffffffffffffff);
      if (pfVar15 < (ulong)local_1c8._8_8_) {
        pfVar26 = (function_record *)((long)&pfVar15->name + 2);
      }
      else {
        pfVar15 = (function_record *)std::__cxx11::string::find((char)local_1c8,0x29);
        pfVar26 = pfVar15;
      }
      if ((pfVar15 <= pfVar24) || ((ulong)local_1c8._8_8_ <= pfVar26)) goto LAB_0010e29e;
      std::__cxx11::string::append((string *)local_138,(ulong)local_1c8,(ulong)pfVar24);
      std::__cxx11::string::push_back((char)(string *)local_138);
      std::__cxx11::string::append((string *)local_138,(ulong)local_1c8,(ulong)pfVar26);
      if ((function_record *)local_1c8._0_8_ != (function_record *)(local_1c8 + 0x10)) {
        operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
      }
    }
    std::__cxx11::string::append((char *)local_138);
    pPVar22 = (PyTypeObject *)pPVar22->tp_hash;
    uVar25 = __val;
  } while (pPVar22 != (PyTypeObject *)0x0);
  std::__cxx11::string::append(local_138);
  local_b8.m_ptr = (PyObject *)local_c8;
  if (local_c8 != (function_record *)0x0) {
    local_c8->name = (char *)((long)&((function_record *)local_c8->name)->name + 1);
  }
  bVar27 = false;
  for (pfVar24 = (function_record *)(ulong)(*(byte *)((long)&local_170->tp_repr + 1) & 1);
      pfVar15 = (function_record *)PyTuple_Size(local_b8.m_ptr), pfVar24 < pfVar15;
      pfVar24 = (function_record *)((long)&pfVar24->name + 1)) {
    bVar7 = true;
    if (bVar27) {
      std::__cxx11::string::append(local_138);
      bVar7 = bVar27;
    }
    bVar27 = bVar7;
    local_198._8_8_ = local_b8.m_ptr;
    local_188._8_8_ = (PyObject *)0x0;
    local_188._0_8_ = pfVar24;
    poVar16 = detail::accessor<pybind11::detail::accessor_policies::tuple_item>::get_cache
                        ((accessor<pybind11::detail::accessor_policies::tuple_item> *)local_198);
    local_168.m_ptr = (poVar16->super_handle).m_ptr;
    if ((function_record *)local_168.m_ptr != (function_record *)0x0) {
      ((function_record *)local_168.m_ptr)->name =
           (char *)((long)&((function_record *)((function_record *)local_168.m_ptr)->name)->name + 1
                   );
    }
    hVar12.m_ptr = (PyObject *)PyObject_Repr(local_168.m_ptr);
    if ((function_record *)hVar12.m_ptr == (function_record *)0x0) {
      this = (error_already_set *)__cxa_allocate_exception(0x28);
      error_already_set::error_already_set(this);
      __cxa_throw(this,&error_already_set::typeinfo,error_already_set::~error_already_set);
    }
    local_158._0_8_ = hVar12.m_ptr;
    str::operator_cast_to_string((string *)local_1c8,(str *)local_158);
    std::__cxx11::string::_M_append(local_138,local_1c8._0_8_);
    if ((function_record *)local_1c8._0_8_ != (function_record *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,(ulong)(local_1c8._16_8_ + 1));
    }
    object::~object((object *)local_158);
    object::~object((object *)&local_168);
    object::~object((object *)(local_188 + 8));
  }
  if (local_c0 != (function_record *)0x0) {
    local_168.m_ptr = (PyObject *)local_c0;
    local_c0->name = (char *)((long)&((function_record *)local_c0->name)->name + 1);
    lVar11 = PyDict_Size();
    if (lVar11 != 0) {
      if (bVar27) {
        std::__cxx11::string::append(local_138);
      }
      std::__cxx11::string::append(local_138);
      local_1c8._0_8_ = local_168.m_ptr;
      oStack_1b0.super_handle.m_ptr = (handle)(PyObject *)0x0;
      iVar10 = PyDict_Next(local_168.m_ptr,local_1c8 + 0x18,local_1c8 + 8,local_1c8 + 0x10);
      if ((iVar10 != 0) && (oStack_1b0.super_handle.m_ptr != (PyObject *)0xffffffffffffffff)) {
        local_158._0_8_ = local_1c8._8_8_;
        local_158._8_8_ = local_1c8._16_8_;
        while( true ) {
          str::str((str *)&local_40,"{}={!r}");
          str::format<pybind11::handle&,pybind11::handle&>
                    ((str *)&local_38,&local_40,(handle *)local_158);
          str::operator_cast_to_string((string *)local_198,(str *)&local_38);
          std::__cxx11::string::_M_append(local_138,local_198._0_8_);
          if ((PyObject *)local_198._0_8_ != (PyObject *)local_188) {
            operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
          }
          object::~object(&local_38);
          object::~object((object *)&local_40);
          iVar10 = PyDict_Next(local_1c8._0_8_,local_1c8 + 0x18,local_1c8 + 8,local_1c8 + 0x10);
          if ((iVar10 == 0) || (oStack_1b0.super_handle.m_ptr == (PyObject *)0xffffffffffffffff))
          break;
          local_158._0_8_ = local_1c8._8_8_;
          local_158._8_8_ = local_1c8._16_8_;
          std::__cxx11::string::append(local_138);
        }
      }
    }
    object::~object((object *)&local_168);
  }
  lVar11 = std::__cxx11::string::find(local_138,0x115111,0);
  if (lVar11 != -1) {
    std::__cxx11::string::append(local_138);
  }
  PyErr_SetString(_PyExc_TypeError,local_138);
  object::~object((object *)&local_b8);
  if (local_138 == (undefined1  [8])(auStack_130 + 8)) {
    return (PyObject *)0x0;
  }
LAB_0010e5ed:
  operator_delete((void *)local_138,(ulong)((long)&((type_info *)stack0xfffffffffffffed8)->type + 1)
                 );
  return (PyObject *)0x0;
}

Assistant:

static PyObject *dispatcher(PyObject *self, PyObject *args_in, PyObject *kwargs_in) {
        using namespace detail;

        /* Iterator over the list of potentially admissible overloads */
        const function_record *overloads = (function_record *) PyCapsule_GetPointer(self, nullptr),
                              *it = overloads;

        /* Need to know how many arguments + keyword arguments there are to pick the right overload */
        const size_t n_args_in = (size_t) PyTuple_GET_SIZE(args_in);

        handle parent = n_args_in > 0 ? PyTuple_GET_ITEM(args_in, 0) : nullptr,
               result = PYBIND11_TRY_NEXT_OVERLOAD;

        auto self_value_and_holder = value_and_holder();
        if (overloads->is_constructor) {
            const auto tinfo = get_type_info((PyTypeObject *) overloads->scope.ptr());
            const auto pi = reinterpret_cast<instance *>(parent.ptr());
            self_value_and_holder = pi->get_value_and_holder(tinfo, false);

            if (!self_value_and_holder.type || !self_value_and_holder.inst) {
                PyErr_SetString(PyExc_TypeError, "__init__(self, ...) called with invalid `self` argument");
                return nullptr;
            }

            // If this value is already registered it must mean __init__ is invoked multiple times;
            // we really can't support that in C++, so just ignore the second __init__.
            if (self_value_and_holder.instance_registered())
                return none().release().ptr();
        }

        try {
            // We do this in two passes: in the first pass, we load arguments with `convert=false`;
            // in the second, we allow conversion (except for arguments with an explicit
            // py::arg().noconvert()).  This lets us prefer calls without conversion, with
            // conversion as a fallback.
            std::vector<function_call> second_pass;

            // However, if there are no overloads, we can just skip the no-convert pass entirely
            const bool overloaded = it != nullptr && it->next != nullptr;

            for (; it != nullptr; it = it->next) {

                /* For each overload:
                   1. Copy all positional arguments we were given, also checking to make sure that
                      named positional arguments weren't *also* specified via kwarg.
                   2. If we weren't given enough, try to make up the omitted ones by checking
                      whether they were provided by a kwarg matching the `py::arg("name")` name.  If
                      so, use it (and remove it from kwargs; if not, see if the function binding
                      provided a default that we can use.
                   3. Ensure that either all keyword arguments were "consumed", or that the function
                      takes a kwargs argument to accept unconsumed kwargs.
                   4. Any positional arguments still left get put into a tuple (for args), and any
                      leftover kwargs get put into a dict.
                   5. Pack everything into a vector; if we have py::args or py::kwargs, they are an
                      extra tuple or dict at the end of the positional arguments.
                   6. Call the function call dispatcher (function_record::impl)

                   If one of these fail, move on to the next overload and keep trying until we get a
                   result other than PYBIND11_TRY_NEXT_OVERLOAD.
                 */

                const function_record &func = *it;
                size_t pos_args = func.nargs;    // Number of positional arguments that we need
                if (func.has_args) --pos_args;   // (but don't count py::args
                if (func.has_kwargs) --pos_args; //  or py::kwargs)

                if (!func.has_args && n_args_in > pos_args)
                    continue; // Too many arguments for this overload

                if (n_args_in < pos_args && func.args.size() < pos_args)
                    continue; // Not enough arguments given, and not enough defaults to fill in the blanks

                function_call call(func, parent);

                size_t args_to_copy = std::min(pos_args, n_args_in);
                size_t args_copied = 0;

                // 0. Inject new-style `self` argument
                if (func.is_new_style_constructor) {
                    // The `value` may have been preallocated by an old-style `__init__`
                    // if it was a preceding candidate for overload resolution.
                    if (self_value_and_holder)
                        self_value_and_holder.type->dealloc(self_value_and_holder);

                    call.init_self = PyTuple_GET_ITEM(args_in, 0);
                    call.args.push_back(reinterpret_cast<PyObject *>(&self_value_and_holder));
                    call.args_convert.push_back(false);
                    ++args_copied;
                }

                // 1. Copy any position arguments given.
                bool bad_arg = false;
                for (; args_copied < args_to_copy; ++args_copied) {
                    const argument_record *arg_rec = args_copied < func.args.size() ? &func.args[args_copied] : nullptr;
                    if (kwargs_in && arg_rec && arg_rec->name && PyDict_GetItemString(kwargs_in, arg_rec->name)) {
                        bad_arg = true;
                        break;
                    }

                    handle arg(PyTuple_GET_ITEM(args_in, args_copied));
                    if (arg_rec && !arg_rec->none && arg.is_none()) {
                        bad_arg = true;
                        break;
                    }
                    call.args.push_back(arg);
                    call.args_convert.push_back(arg_rec ? arg_rec->convert : true);
                }
                if (bad_arg)
                    continue; // Maybe it was meant for another overload (issue #688)

                // We'll need to copy this if we steal some kwargs for defaults
                dict kwargs = reinterpret_borrow<dict>(kwargs_in);

                // 2. Check kwargs and, failing that, defaults that may help complete the list
                if (args_copied < pos_args) {
                    bool copied_kwargs = false;

                    for (; args_copied < pos_args; ++args_copied) {
                        const auto &arg = func.args[args_copied];

                        handle value;
                        if (kwargs_in && arg.name)
                            value = PyDict_GetItemString(kwargs.ptr(), arg.name);

                        if (value) {
                            // Consume a kwargs value
                            if (!copied_kwargs) {
                                kwargs = reinterpret_steal<dict>(PyDict_Copy(kwargs.ptr()));
                                copied_kwargs = true;
                            }
                            PyDict_DelItemString(kwargs.ptr(), arg.name);
                        } else if (arg.value) {
                            value = arg.value;
                        }

                        if (value) {
                            call.args.push_back(value);
                            call.args_convert.push_back(arg.convert);
                        }
                        else
                            break;
                    }

                    if (args_copied < pos_args)
                        continue; // Not enough arguments, defaults, or kwargs to fill the positional arguments
                }

                // 3. Check everything was consumed (unless we have a kwargs arg)
                if (kwargs && kwargs.size() > 0 && !func.has_kwargs)
                    continue; // Unconsumed kwargs, but no py::kwargs argument to accept them

                // 4a. If we have a py::args argument, create a new tuple with leftovers
                if (func.has_args) {
                    tuple extra_args;
                    if (args_to_copy == 0) {
                        // We didn't copy out any position arguments from the args_in tuple, so we
                        // can reuse it directly without copying:
                        extra_args = reinterpret_borrow<tuple>(args_in);
                    } else if (args_copied >= n_args_in) {
                        extra_args = tuple(0);
                    } else {
                        size_t args_size = n_args_in - args_copied;
                        extra_args = tuple(args_size);
                        for (size_t i = 0; i < args_size; ++i) {
                            extra_args[i] = PyTuple_GET_ITEM(args_in, args_copied + i);
                        }
                    }
                    call.args.push_back(extra_args);
                    call.args_convert.push_back(false);
                    call.args_ref = std::move(extra_args);
                }

                // 4b. If we have a py::kwargs, pass on any remaining kwargs
                if (func.has_kwargs) {
                    if (!kwargs.ptr())
                        kwargs = dict(); // If we didn't get one, send an empty one
                    call.args.push_back(kwargs);
                    call.args_convert.push_back(false);
                    call.kwargs_ref = std::move(kwargs);
                }

                // 5. Put everything in a vector.  Not technically step 5, we've been building it
                // in `call.args` all along.
                #if !defined(NDEBUG)
                if (call.args.size() != func.nargs || call.args_convert.size() != func.nargs)
                    pybind11_fail("Internal error: function call dispatcher inserted wrong number of arguments!");
                #endif

                std::vector<bool> second_pass_convert;
                if (overloaded) {
                    // We're in the first no-convert pass, so swap out the conversion flags for a
                    // set of all-false flags.  If the call fails, we'll swap the flags back in for
                    // the conversion-allowed call below.
                    second_pass_convert.resize(func.nargs, false);
                    call.args_convert.swap(second_pass_convert);
                }

                // 6. Call the function.
                try {
                    loader_life_support guard{};
                    result = func.impl(call);
                } catch (reference_cast_error &) {
                    result = PYBIND11_TRY_NEXT_OVERLOAD;
                }

                if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD)
                    break;

                if (overloaded) {
                    // The (overloaded) call failed; if the call has at least one argument that
                    // permits conversion (i.e. it hasn't been explicitly specified `.noconvert()`)
                    // then add this call to the list of second pass overloads to try.
                    for (size_t i = func.is_method ? 1 : 0; i < pos_args; i++) {
                        if (second_pass_convert[i]) {
                            // Found one: swap the converting flags back in and store the call for
                            // the second pass.
                            call.args_convert.swap(second_pass_convert);
                            second_pass.push_back(std::move(call));
                            break;
                        }
                    }
                }
            }

            if (overloaded && !second_pass.empty() && result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
                // The no-conversion pass finished without success, try again with conversion allowed
                for (auto &call : second_pass) {
                    try {
                        loader_life_support guard{};
                        result = call.func.impl(call);
                    } catch (reference_cast_error &) {
                        result = PYBIND11_TRY_NEXT_OVERLOAD;
                    }

                    if (result.ptr() != PYBIND11_TRY_NEXT_OVERLOAD) {
                        // The error reporting logic below expects 'it' to be valid, as it would be
                        // if we'd encountered this failure in the first-pass loop.
                        if (!result)
                            it = &call.func;
                        break;
                    }
                }
            }
        } catch (error_already_set &e) {
            e.restore();
            return nullptr;
        } catch (...) {
            /* When an exception is caught, give each registered exception
               translator a chance to translate it to a Python exception
               in reverse order of registration.

               A translator may choose to do one of the following:

                - catch the exception and call PyErr_SetString or PyErr_SetObject
                  to set a standard (or custom) Python exception, or
                - do nothing and let the exception fall through to the next translator, or
                - delegate translation to the next translator by throwing a new type of exception. */

            auto last_exception = std::current_exception();
            auto &registered_exception_translators = get_internals().registered_exception_translators;
            for (auto& translator : registered_exception_translators) {
                try {
                    translator(last_exception);
                } catch (...) {
                    last_exception = std::current_exception();
                    continue;
                }
                return nullptr;
            }
            PyErr_SetString(PyExc_SystemError, "Exception escaped from default exception translator!");
            return nullptr;
        }

        auto append_note_if_missing_header_is_suspected = [](std::string &msg) {
            if (msg.find("std::") != std::string::npos) {
                msg += "\n\n"
                       "Did you forget to `#include <pybind11/stl.h>`? Or <pybind11/complex.h>,\n"
                       "<pybind11/functional.h>, <pybind11/chrono.h>, etc. Some automatic\n"
                       "conversions are optional and require extra headers to be included\n"
                       "when compiling your pybind11 module.";
            }
        };

        if (result.ptr() == PYBIND11_TRY_NEXT_OVERLOAD) {
            if (overloads->is_operator)
                return handle(Py_NotImplemented).inc_ref().ptr();

            std::string msg = std::string(overloads->name) + "(): incompatible " +
                std::string(overloads->is_constructor ? "constructor" : "function") +
                " arguments. The following argument types are supported:\n";

            int ctr = 0;
            for (const function_record *it2 = overloads; it2 != nullptr; it2 = it2->next) {
                msg += "    "+ std::to_string(++ctr) + ". ";

                bool wrote_sig = false;
                if (overloads->is_constructor) {
                    // For a constructor, rewrite `(self: Object, arg0, ...) -> NoneType` as `Object(arg0, ...)`
                    std::string sig = it2->signature;
                    size_t start = sig.find('(') + 7; // skip "(self: "
                    if (start < sig.size()) {
                        // End at the , for the next argument
                        size_t end = sig.find(", "), next = end + 2;
                        size_t ret = sig.rfind(" -> ");
                        // Or the ), if there is no comma:
                        if (end >= sig.size()) next = end = sig.find(')');
                        if (start < end && next < sig.size()) {
                            msg.append(sig, start, end - start);
                            msg += '(';
                            msg.append(sig, next, ret - next);
                            wrote_sig = true;
                        }
                    }
                }
                if (!wrote_sig) msg += it2->signature;

                msg += "\n";
            }
            msg += "\nInvoked with: ";
            auto args_ = reinterpret_borrow<tuple>(args_in);
            bool some_args = false;
            for (size_t ti = overloads->is_constructor ? 1 : 0; ti < args_.size(); ++ti) {
                if (!some_args) some_args = true;
                else msg += ", ";
                msg += pybind11::repr(args_[ti]);
            }
            if (kwargs_in) {
                auto kwargs = reinterpret_borrow<dict>(kwargs_in);
                if (kwargs.size() > 0) {
                    if (some_args) msg += "; ";
                    msg += "kwargs: ";
                    bool first = true;
                    for (auto kwarg : kwargs) {
                        if (first) first = false;
                        else msg += ", ";
                        msg += pybind11::str("{}={!r}").format(kwarg.first, kwarg.second);
                    }
                }
            }

            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else if (!result) {
            std::string msg = "Unable to convert function return value to a "
                              "Python type! The signature was\n\t";
            msg += it->signature;
            append_note_if_missing_header_is_suspected(msg);
            PyErr_SetString(PyExc_TypeError, msg.c_str());
            return nullptr;
        } else {
            if (overloads->is_constructor && !self_value_and_holder.holder_constructed()) {
                auto *pi = reinterpret_cast<instance *>(parent.ptr());
                self_value_and_holder.type->init_instance(pi, nullptr);
            }
            return result.ptr();
        }
    }